

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O3

void __thiscall wasm::MultiMemoryLowering::run(MultiMemoryLowering *this,Module *module)

{
  byte *pbVar1;
  pointer puVar2;
  Export *pEVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exp;
  pointer puVar7;
  variant<wasm::Name,_wasm::HeapType> *pvVar8;
  WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
  local_150;
  MultiMemoryLowering *local_20;
  Module *local_18;
  
  pbVar1 = (byte *)((long)&(module->features).features + 1);
  *pbVar1 = *pbVar1 & 0x7f;
  if (8 < (ulong)((long)(module->memories).
                        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(module->memories).
                       super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)) {
    this->wasm = module;
    prepCombinedMemory(this);
    makeOffsetGlobals(this);
    wasm::ModuleUtils::
    iterActiveDataSegments<wasm::MultiMemoryLowering::adjustActiveDataSegmentOffsets()::_lambda(wasm::DataSegment*)_1_>
              (this->wasm,(anon_class_8_1_8991fb9c)this);
    createMemorySizeFunctions(this);
    createMemoryGrowFunctions(this);
    removeExistingMemories(this);
    addCombinedMemory(this);
    local_18 = this->wasm;
    if (this->isExported == true) {
      puVar7 = (local_18->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar2 = (local_18->exports).
               super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (puVar7 != puVar2) {
        do {
          pEVar3 = (puVar7->_M_t).
                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                   super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
          if (pEVar3->kind == Memory) {
            pvVar8 = &pEVar3->value;
            if (*(__index_type *)
                 ((long)&(pEVar3->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) !=
                '\0') {
              pvVar8 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
            }
            uVar4 = *(undefined4 *)((long)&(this->combinedMemory).super_IString.str._M_len + 4);
            uVar5 = *(undefined4 *)&(this->combinedMemory).super_IString.str._M_str;
            uVar6 = *(undefined4 *)((long)&(this->combinedMemory).super_IString.str._M_str + 4);
            *(int *)&(pvVar8->super__Variant_base<wasm::Name,_wasm::HeapType>).
                     super__Move_assign_alias<wasm::Name,_wasm::HeapType> =
                 (int)(this->combinedMemory).super_IString.str._M_len;
            *(undefined4 *)
             ((long)&(pvVar8->super__Variant_base<wasm::Name,_wasm::HeapType>).
                     super__Move_assign_alias<wasm::Name,_wasm::HeapType> + 4) = uVar4;
            *(undefined4 *)
             ((long)&(pvVar8->super__Variant_base<wasm::Name,_wasm::HeapType>).
                     super__Move_assign_alias<wasm::Name,_wasm::HeapType> + 8) = uVar5;
            *(undefined4 *)
             ((long)&(pvVar8->super__Variant_base<wasm::Name,_wasm::HeapType>).
                     super__Move_assign_alias<wasm::Name,_wasm::HeapType> + 0xc) = uVar6;
          }
          puVar7 = puVar7 + 1;
        } while (puVar7 != puVar2);
        local_18 = this->wasm;
      }
    }
    local_150.super_Pass.name._M_dataplus._M_p = (pointer)&local_150.super_Pass.name.field_2;
    local_150.super_Pass.runner = (PassRunner *)0x0;
    local_150.super_Pass.name._M_string_length = 0;
    local_150.super_Pass.name.field_2._M_local_buf[0] = '\0';
    local_150.super_Pass.passArg.
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
    local_150.
    super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
    .
    super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
    .replacep = (Expression **)0x0;
    local_150.
    super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
    .
    super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
    .stack.usedFixed = 0;
    local_150.
    super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
    .
    super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>::Task,_std::allocator<wasm::Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_150.
    super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
    .
    super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>::Task,_std::allocator<wasm::Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_150.
    super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
    .
    super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
    .stack.flexible.
    super__Vector_base<wasm::Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>::Task,_std::allocator<wasm::Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_150.
    super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
    .
    super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
    .currFunction = (Function *)0x0;
    local_150.
    super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
    .
    super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
    .currModule = (Module *)0x0;
    local_150.super_Pass._vptr_Pass = (_func_int **)&PTR__WalkerPass_01073f18;
    local_20 = this;
    WalkerPass<wasm::PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>_>
    ::run(&local_150,(this->super_Pass).runner,local_18);
    if (local_150.
        super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
        .
        super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>::Task,_std::allocator<wasm::Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_150.
                      super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                      .
                      super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                      .stack.flexible.
                      super__Vector_base<wasm::Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>::Task,_std::allocator<wasm::Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_150.
                            super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                            .
                            super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                            .stack.flexible.
                            super__Vector_base<wasm::Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>::Task,_std::allocator<wasm::Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_150.
                            super_PostWalker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                            .
                            super_Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>
                            .stack.flexible.
                            super__Vector_base<wasm::Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>::Task,_std::allocator<wasm::Walker<wasm::MultiMemoryLowering::Replacer,_wasm::Visitor<wasm::MultiMemoryLowering::Replacer,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    Pass::~Pass(&local_150.super_Pass);
  }
  return;
}

Assistant:

void run(Module* module) override {
    module->features.disable(FeatureSet::MultiMemory);

    // If there are no memories or 1 memory, skip this pass
    if (module->memories.size() <= 1) {
      return;
    }

    this->wasm = module;

    prepCombinedMemory();
    makeOffsetGlobals();
    adjustActiveDataSegmentOffsets();
    createMemorySizeFunctions();
    createMemoryGrowFunctions();
    removeExistingMemories();
    addCombinedMemory();
    if (isExported) {
      updateMemoryExports();
    }

    Replacer(*this, *wasm).run(getPassRunner(), wasm);
  }